

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall
LinearNE<0,_1,_0>::LinearNE
          (LinearNE<0,_1,_0> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  vec<IntView<0>_> w;
  LinearNE<0,_1,_0> *local_58;
  IntView<0> *pIStack_50;
  IntView<0> local_40;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_58 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_58);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearNE_0020e1b0;
  uVar2 = _x->sz;
  this->sz = uVar2;
  this->c = _c;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  (this->num_unfixed).v = uVar2;
  (this->sum_fixed).v = (long)-_c;
  local_58 = (LinearNE<0,_1,_0> *)0x0;
  pIStack_50 = (IntView<0> *)0x0;
  uVar2 = a->sz;
  if (uVar2 == 0) {
    *(undefined4 *)&(this->super_Propagator).field_0x14 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (-1 < a->data[uVar3]) {
        local_40.var = _x->data[uVar3];
        local_40.b = 0;
        local_40.a = a->data[uVar3];
        vec<IntView<0>_>::push((vec<IntView<0>_> *)&local_58,&local_40);
        uVar2 = a->sz;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
    *(uint *)&(this->super_Propagator).field_0x14 = (uint)local_58;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if (a->data[uVar3] < 0) {
          local_40.var = _x->data[uVar3];
          local_40.a = -a->data[uVar3];
          local_40.b = 0;
          vec<IntView<0>_>::push((vec<IntView<0>_> *)&local_58,&local_40);
          uVar2 = a->sz;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
  }
  this->x = pIStack_50;
  this->y = (IntView<1> *)pIStack_50;
  local_58 = (LinearNE<0,_1,_0> *)0x0;
  pIStack_50 = (IntView<0> *)0x0;
  if (0 < this->sz) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      plVar1 = *(long **)((long)&this->x->var + lVar4);
      (**(code **)(*plVar1 + 0x38))(plVar1,this,uVar3 & 0xffffffff,8);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((long)uVar3 < (long)this->sz);
    if (pIStack_50 != (IntView<0> *)0x0) {
      free(pIStack_50);
    }
  }
  return;
}

Assistant:

LinearNE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: sz(_x.size()), c(_c), r(std::move(_r)), num_unfixed(sz), sum_fixed(-c) {
		vec<IntView<0> > w;
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] >= 0) {
				w.push(IntView<0>(_x[i], a[i]));
			}
		}
		sp = w.size();
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] < 0) {
				w.push(IntView<0>(_x[i], -a[i]));
			}
		}
		x = (IntView<U>*)(IntView<0>*)w;
		y = (IntView<V>*)(IntView<0>*)w;
		w.release();

		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_F);
		}
		if (R != 0) {
			r.attach(this, sz, EVENT_L);
		}
		//		printf("LinearNE: %d %d %d %d %d\n", sp, sz, U, V, R);
	}